

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O2

int gdImageColorClosestHWB(gdImagePtr im,int r,int g,int b)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  float fVar8;
  float fVar9;
  RGBType RGB;
  RGBType RGB_00;
  HWBType HWB2;
  HWBType HWB1;
  
  if (im->trueColor == 0) {
    auVar6._0_8_ = (double)r;
    auVar6._8_8_ = (double)g;
    auVar6 = divpd(auVar6,_DAT_00122000);
    RGB_00.R = (float)auVar6._0_8_;
    RGB_00.G = (float)auVar6._8_8_;
    uVar5 = 0;
    uVar4 = (ulong)(uint)im->colorsTotal;
    if (im->colorsTotal < 1) {
      uVar4 = uVar5;
    }
    fVar8 = 0.0;
    bVar1 = true;
    uVar3 = 0xffffffffffffffff;
    for (; iVar2 = (int)uVar3, uVar4 != uVar5; uVar5 = uVar5 + 1) {
      if (im->open[uVar5] == 0) {
        auVar7._0_8_ = (double)im->red[uVar5];
        auVar7._8_8_ = (double)im->green[uVar5];
        auVar6 = divpd(auVar7,_DAT_00122000);
        RGB.R = (float)auVar6._0_8_;
        RGB.G = (float)auVar6._8_8_;
        RGB.B = (float)im->blue[uVar5] / 255.0;
        RGB_to_HWB(RGB,&HWB1);
        RGB_00.B = (float)b / 255.0;
        RGB_to_HWB(RGB_00,&HWB2);
        fVar9 = 0.0;
        if ((HWB1.H != -1.0) || (NAN(HWB1.H))) {
          if (((HWB2.H != -1.0) || (NAN(HWB2.H))) && (fVar9 = ABS(HWB1.H - HWB2.H), 3.0 < fVar9)) {
            fVar9 = 6.0 - fVar9;
          }
        }
        fVar9 = (HWB1.B - HWB2.B) * (HWB1.B - HWB2.B) +
                fVar9 * fVar9 + (HWB1.W - HWB2.W) * (HWB1.W - HWB2.W);
        if (fVar9 < fVar8 || bVar1) {
          uVar3 = uVar5;
        }
        uVar3 = uVar3 & 0xffffffff;
        if (fVar8 <= fVar9 && !bVar1) {
          fVar9 = fVar8;
        }
        bVar1 = false;
        fVar8 = fVar9;
      }
    }
  }
  else {
    iVar2 = g * 0x100 + r * 0x10000 + b;
  }
  return iVar2;
}

Assistant:

BGD_DECLARE(int) gdImageColorClosestHWB (gdImagePtr im, int r, int g, int b)
{
	int i;
	/* long rd, gd, bd; */
	int ct = (-1);
	int first = 1;
	float mindist = 0;
	if (im->trueColor) {
		return gdTrueColor (r, g, b);
	}
	for (i = 0; (i < (im->colorsTotal)); i++) {
		float dist;
		if (im->open[i]) {
			continue;
		}
		dist = HWB_Diff (im->red[i], im->green[i], im->blue[i], r, g, b);
		if (first || (dist < mindist)) {
			mindist = dist;
			ct = i;
			first = 0;
		}
	}
	return ct;
}